

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

void __thiscall
Parser::parseMetadata(Parser *this,QString *data,qsizetype offset,QStringList *includes)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  EnumNameValue *pEVar4;
  iterator iVar5;
  reference s;
  char *pcVar6;
  const_reference pEVar7;
  qsizetype qVar8;
  QStringList *in_RSI;
  QString *in_RDI;
  long in_FS_OFFSET;
  EnumNameValue *v_1;
  add_const_t<QList<EnumNameValue>_> *__range4;
  int prevValue;
  EnumNameValue *v;
  QList<EnumNameValue> *__range6;
  bool rangeFound;
  int i_1;
  bool flags;
  int cur;
  qsizetype prev;
  qsizetype endOfPoint;
  qsizetype endOfProvider;
  qsizetype beginOfProvider;
  char16_t *str_8;
  char16_t *str;
  char16_t *str_1;
  char16_t *str_4;
  char16_t *str_2;
  char16_t *str_3;
  char16_t *str_5;
  char16_t *str_6;
  char16_t *str_7;
  QString a;
  const_iterator __end4;
  const_iterator __begin4;
  iterator iter;
  QString rangeEnd;
  iterator __end6;
  iterator __begin6;
  QList<EnumNameValue> moreValues;
  QStringList values_1;
  QString name;
  QString enumOrFlag;
  QRegularExpressionMatch rm;
  QRegularExpressionMatchIterator r;
  QRegularExpression rangeMacro;
  QStringList ranges;
  QString values;
  QRegularExpressionMatch match;
  QRegularExpressionMatchIterator i;
  QRegularExpression macro;
  QString preprocessed;
  QString provider;
  QString metadata;
  DataPointer *in_stack_fffffffffffff838;
  QArrayDataPointer<char16_t> *in_stack_fffffffffffff840;
  QList<QString> *this_00;
  QListSpecialMethods<QString> *in_stack_fffffffffffff848;
  rvalue_ref pQVar9;
  QString *in_stack_fffffffffffff850;
  QListSpecialMethods<QString> *in_stack_fffffffffffff858;
  undefined7 in_stack_fffffffffffff860;
  byte in_stack_fffffffffffff867;
  anon_class_8_1_f6fe17dc_for__M_pred in_stack_fffffffffffff868;
  undefined4 in_stack_fffffffffffff870;
  MatchType in_stack_fffffffffffff874;
  iterator in_stack_fffffffffffff878;
  int in_stack_fffffffffffff880;
  int in_stack_fffffffffffff884;
  EnumNameValue *in_stack_fffffffffffff888;
  bool local_761;
  QStringList *pQVar10;
  QStringList *includes_00;
  Parser *in_stack_fffffffffffff8c8;
  int local_728;
  iterator in_stack_fffffffffffff8e8;
  int local_6dc;
  rvalue_ref local_6d0;
  QChar local_564;
  QChar local_562;
  QArrayDataPointer<char16_t> local_560 [3];
  QChar local_512;
  QArrayDataPointer<char16_t> local_510 [5];
  QChar local_494;
  QChar local_492;
  QArrayDataPointer<char16_t> local_490 [4];
  undefined8 local_430;
  undefined8 local_428;
  undefined8 local_420;
  EnumNameValue *local_418;
  const_iterator local_410;
  const_iterator local_408 [7];
  QChar local_3ce;
  QChar local_3cc;
  QChar local_3ca;
  QArrayDataPointer<char16_t> local_3c8 [5];
  iterator local_350;
  QString local_348;
  EnumNameValue *local_330;
  iterator local_328;
  iterator local_320;
  undefined8 local_318;
  undefined8 local_310;
  undefined8 local_308;
  QLatin1Char local_2cb [3];
  undefined8 local_2c8;
  undefined8 local_2c0;
  undefined8 local_2b8;
  QArrayDataPointer<char16_t> local_2b0 [2];
  undefined8 local_280;
  undefined8 local_278;
  undefined8 local_270;
  undefined8 local_268;
  undefined8 local_260;
  undefined8 local_258;
  undefined8 local_220;
  undefined8 local_210;
  QArrayDataPointer<char16_t> local_200 [2];
  undefined8 local_1d0;
  QArrayDataPointer<char16_t> local_1c8 [2];
  QList<QString> local_198;
  QLatin1Char local_17f [4];
  QLatin1Char local_17b [3];
  QArrayDataPointer<char16_t> local_178 [4];
  undefined8 local_118;
  undefined8 local_110;
  undefined8 local_108;
  undefined8 local_100;
  undefined8 local_f0;
  QArrayDataPointer<char16_t> local_e0 [2];
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_a0;
  undefined8 local_98;
  QLatin1Char local_5b [27];
  undefined8 local_40;
  undefined8 local_38;
  undefined8 local_30;
  undefined8 local_28;
  undefined8 local_20;
  undefined8 local_18;
  QLatin1Char local_f [4];
  QLatin1Char local_b [3];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar10 = in_RSI;
  QLatin1Char::QLatin1Char(local_b,'(');
  QChar::QChar<QLatin1Char,_true>
            ((QChar *)in_stack_fffffffffffff840,
             (QLatin1Char)(char)((ulong)in_stack_fffffffffffff848 >> 0x38));
  QString::indexOf((QString *)in_stack_fffffffffffff848,
                   (QChar)(char16_t)((ulong)in_stack_fffffffffffff868.rangeEnd >> 0x30),
                   (qsizetype)in_stack_fffffffffffff840,
                   (CaseSensitivity)((ulong)in_stack_fffffffffffff838 >> 0x20));
  includes_00 = in_RSI;
  QLatin1Char::QLatin1Char(local_f,',');
  QChar::QChar<QLatin1Char,_true>
            ((QChar *)in_stack_fffffffffffff840,
             (QLatin1Char)(char)((ulong)in_stack_fffffffffffff848 >> 0x38));
  QString::indexOf((QString *)in_stack_fffffffffffff848,
                   (QChar)(char16_t)((ulong)in_stack_fffffffffffff868.rangeEnd >> 0x30),
                   (qsizetype)in_stack_fffffffffffff840,
                   (CaseSensitivity)((ulong)in_stack_fffffffffffff838 >> 0x20));
  local_28 = 0xaaaaaaaaaaaaaaaa;
  local_20 = 0xaaaaaaaaaaaaaaaa;
  local_18 = 0xaaaaaaaaaaaaaaaa;
  QString::QString((QString *)0x10d0e2);
  local_40 = 0xaaaaaaaaaaaaaaaa;
  local_38 = 0xaaaaaaaaaaaaaaaa;
  local_30 = 0xaaaaaaaaaaaaaaaa;
  QString::mid(in_stack_fffffffffffff868.rangeEnd,
               CONCAT17(in_stack_fffffffffffff867,in_stack_fffffffffffff860),
               (qsizetype)in_stack_fffffffffffff858);
  QString::simplified((QString *)in_stack_fffffffffffff838);
  QString::~QString((QString *)0x10d166);
  bVar1 = ::operator!=((QString *)in_stack_fffffffffffff840,(QString *)in_stack_fffffffffffff838);
  if (!bVar1) {
    QLatin1Char::QLatin1Char(local_5b,')');
    QChar::QChar<QLatin1Char,_true>
              ((QChar *)in_stack_fffffffffffff840,
               (QLatin1Char)(char)((ulong)in_stack_fffffffffffff848 >> 0x38));
    QString::indexOf((QString *)in_stack_fffffffffffff848,
                     (QChar)(char16_t)((ulong)in_stack_fffffffffffff868.rangeEnd >> 0x30),
                     (qsizetype)in_stack_fffffffffffff840,
                     (CaseSensitivity)((ulong)in_stack_fffffffffffff838 >> 0x20));
    QString::mid(in_stack_fffffffffffff868.rangeEnd,
                 CONCAT17(in_stack_fffffffffffff867,in_stack_fffffffffffff860),
                 (qsizetype)in_stack_fffffffffffff858);
    QString::simplified((QString *)in_stack_fffffffffffff838);
    QString::operator=((QString *)in_stack_fffffffffffff840,(QString *)in_stack_fffffffffffff838);
    QString::~QString((QString *)0x10d263);
    QString::~QString((QString *)0x10d270);
    local_a8 = 0xaaaaaaaaaaaaaaaa;
    local_a0 = 0xaaaaaaaaaaaaaaaa;
    local_98 = 0xaaaaaaaaaaaaaaaa;
    preprocessMetadata(in_stack_fffffffffffff868.rangeEnd);
    local_b0 = 0xaaaaaaaaaaaaaaaa;
    QArrayDataPointer<char16_t>::QArrayDataPointer
              (local_e0,(Data *)0x0,L"([A-Z]*) ?{ ?([A-Za-z0-9=_,. ]*) ?} ?([A-Za-z0-9_:]*) ?;",0x38
              );
    QString::QString((QString *)in_stack_fffffffffffff840,in_stack_fffffffffffff838);
    QFlags<QRegularExpression::PatternOption>::QFlags
              ((QFlags<QRegularExpression::PatternOption> *)in_stack_fffffffffffff840,
               (PatternOption)((ulong)in_stack_fffffffffffff838 >> 0x20));
    QRegularExpression::QRegularExpression
              ((QRegularExpression *)in_stack_fffffffffffff850,(QString *)in_stack_fffffffffffff848,
               (QFlagsStorageHelper<QRegularExpression::PatternOption,_4>)
               SUB84((ulong)in_stack_fffffffffffff858 >> 0x20,0));
    QString::~QString((QString *)0x10d35b);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(in_stack_fffffffffffff840);
    local_f0 = 0xaaaaaaaaaaaaaaaa;
    QFlags<QRegularExpression::MatchOption>::QFlags
              ((QFlags<QRegularExpression::MatchOption> *)in_stack_fffffffffffff840,
               (MatchOption)((ulong)in_stack_fffffffffffff838 >> 0x20));
    QRegularExpression::globalMatch
              ((QRegularExpression *)in_stack_fffffffffffff888,
               (QString *)CONCAT44(in_stack_fffffffffffff884,in_stack_fffffffffffff880),
               (qsizetype)in_stack_fffffffffffff878.i,in_stack_fffffffffffff874,
               (QFlagsStorageHelper<QRegularExpression::MatchOption,_4>)
               SUB84((ulong)in_RSI >> 0x20,0));
    local_6d0 = (rvalue_ref)0x0;
    while (bVar1 = QRegularExpressionMatchIterator::hasNext
                             ((QRegularExpressionMatchIterator *)0x10d3cb), bVar1) {
      local_100 = 0xaaaaaaaaaaaaaaaa;
      QRegularExpressionMatchIterator::next
                ((QRegularExpressionMatchIterator *)in_stack_fffffffffffff858);
      local_118 = 0xaaaaaaaaaaaaaaaa;
      local_110 = 0xaaaaaaaaaaaaaaaa;
      local_108 = 0xaaaaaaaaaaaaaaaa;
      QRegularExpressionMatch::captured
                ((QRegularExpressionMatch *)in_stack_fffffffffffff850,
                 (int)((ulong)in_stack_fffffffffffff848 >> 0x20));
      QString::trimmed((QString *)in_stack_fffffffffffff838);
      QString::~QString((QString *)0x10d461);
      qVar8 = QRegularExpressionMatch::capturedStart
                        ((QRegularExpressionMatch *)in_stack_fffffffffffff848,
                         (int)((ulong)in_stack_fffffffffffff840 >> 0x20));
      if ((long)local_6d0 < (long)(int)qVar8) {
        QString::mid(in_stack_fffffffffffff868.rangeEnd,
                     CONCAT17(in_stack_fffffffffffff867,in_stack_fffffffffffff860),
                     (qsizetype)in_stack_fffffffffffff858);
        QList<QString>::append
                  ((QList<QString> *)in_stack_fffffffffffff840,(rvalue_ref)in_stack_fffffffffffff838
                  );
        QString::~QString((QString *)0x10d4e6);
      }
      qVar8 = QRegularExpressionMatch::capturedEnd
                        ((QRegularExpressionMatch *)in_stack_fffffffffffff848,
                         (int)((ulong)in_stack_fffffffffffff840 >> 0x20));
      local_6d0 = (rvalue_ref)(qVar8 + 1);
      bVar1 = QString::isEmpty((QString *)0x10d50e);
      local_761 = true;
      if (!bVar1) {
        QArrayDataPointer<char16_t>::QArrayDataPointer(local_178,(Data *)0x0,L"AUTO",4);
        QString::QString((QString *)in_stack_fffffffffffff840,in_stack_fffffffffffff838);
        local_761 = QString::startsWith((QString *)in_stack_fffffffffffff848,
                                        (QString *)in_stack_fffffffffffff840,
                                        (CaseSensitivity)((ulong)in_stack_fffffffffffff838 >> 0x20))
        ;
        QString::~QString((QString *)0x10d5e0);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(in_stack_fffffffffffff840);
      }
      if (local_761 == false) {
        in_stack_fffffffffffff858 = (QListSpecialMethods<QString> *)(in_RDI + 4);
        QRegularExpressionMatch::captured
                  ((QRegularExpressionMatch *)in_stack_fffffffffffff850,
                   (int)((ulong)in_stack_fffffffffffff848 >> 0x20));
        bVar1 = QListSpecialMethods<QString>::contains
                          (in_stack_fffffffffffff848,(QString *)in_stack_fffffffffffff840,
                           (CaseSensitivity)((ulong)in_stack_fffffffffffff838 >> 0x20));
        in_stack_fffffffffffff867 = bVar1 ^ 0xff;
        QString::~QString((QString *)0x10e733);
        if ((in_stack_fffffffffffff867 & 1) != 0) {
          in_stack_fffffffffffff850 = in_RDI + 4;
          QRegularExpressionMatch::captured
                    ((QRegularExpressionMatch *)in_stack_fffffffffffff850,
                     (int)((ulong)in_stack_fffffffffffff848 >> 0x20));
          QList<QString>::append
                    ((QList<QString> *)in_stack_fffffffffffff840,
                     (rvalue_ref)in_stack_fffffffffffff838);
          QString::~QString((QString *)0x10e784);
        }
      }
      else {
        QLatin1Char::QLatin1Char(local_17b,'\n');
        QChar::QChar<QLatin1Char,_true>
                  ((QChar *)in_stack_fffffffffffff840,
                   (QLatin1Char)(char)((ulong)in_stack_fffffffffffff848 >> 0x38));
        QLatin1Char::QLatin1Char(local_17f,' ');
        QChar::QChar<QLatin1Char,_true>
                  ((QChar *)in_stack_fffffffffffff840,
                   (QLatin1Char)(char)((ulong)in_stack_fffffffffffff848 >> 0x38));
        QString::replace((QString *)includes_00,
                         (QChar)(char16_t)((ulong)in_stack_fffffffffffff8e8.i >> 0x30),
                         (QChar)(char16_t)((ulong)in_stack_fffffffffffff8e8.i >> 0x20),
                         (CaseSensitivity)((ulong)pQVar10 >> 0x20));
        local_198.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
        local_198.d.ptr = (QString *)0xaaaaaaaaaaaaaaaa;
        local_198.d.size = -0x5555555555555556;
        QList<QString>::QList((QList<QString> *)0x10d6b3);
        QArrayDataPointer<char16_t>::QArrayDataPointer(local_1c8,(Data *)0x0,L"RANGE",5);
        QString::QString((QString *)in_stack_fffffffffffff840,in_stack_fffffffffffff838);
        bVar1 = QString::contains((QString *)in_stack_fffffffffffff840,
                                  (QString *)in_stack_fffffffffffff838,CaseInsensitive);
        QString::~QString((QString *)0x10d740);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(in_stack_fffffffffffff840);
        if (bVar1) {
          local_1d0 = 0xaaaaaaaaaaaaaaaa;
          QArrayDataPointer<char16_t>::QArrayDataPointer
                    (local_200,(Data *)0x0,L"RANGE +([A-Za-z0-9_]*) +... +([A-Za-z0-9_]*)",0x2c);
          QString::QString((QString *)in_stack_fffffffffffff840,in_stack_fffffffffffff838);
          QFlags<QRegularExpression::PatternOption>::QFlags
                    ((QFlags<QRegularExpression::PatternOption> *)in_stack_fffffffffffff840,
                     (PatternOption)((ulong)in_stack_fffffffffffff838 >> 0x20));
          QRegularExpression::QRegularExpression
                    ((QRegularExpression *)in_stack_fffffffffffff850,
                     (QString *)in_stack_fffffffffffff848,
                     (QFlagsStorageHelper<QRegularExpression::PatternOption,_4>)
                     SUB84((ulong)in_stack_fffffffffffff858 >> 0x20,0));
          QString::~QString((QString *)0x10d803);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(in_stack_fffffffffffff840);
          local_210 = 0xaaaaaaaaaaaaaaaa;
          QFlags<QRegularExpression::MatchOption>::QFlags
                    ((QFlags<QRegularExpression::MatchOption> *)in_stack_fffffffffffff840,
                     (MatchOption)((ulong)in_stack_fffffffffffff838 >> 0x20));
          QRegularExpression::globalMatch
                    ((QRegularExpression *)in_stack_fffffffffffff888,
                     (QString *)CONCAT44(in_stack_fffffffffffff884,in_stack_fffffffffffff880),
                     (qsizetype)in_stack_fffffffffffff878.i,in_stack_fffffffffffff874,
                     (QFlagsStorageHelper<QRegularExpression::MatchOption,_4>)
                     SUB84((ulong)in_RSI >> 0x20,0));
          while (bVar1 = QRegularExpressionMatchIterator::hasNext
                                   ((QRegularExpressionMatchIterator *)0x10d867), bVar1) {
            local_220 = 0xaaaaaaaaaaaaaaaa;
            QRegularExpressionMatchIterator::next
                      ((QRegularExpressionMatchIterator *)in_stack_fffffffffffff858);
            QRegularExpressionMatch::captured
                      ((QRegularExpressionMatch *)in_stack_fffffffffffff850,
                       (int)((ulong)in_stack_fffffffffffff848 >> 0x20));
            QList<QString>::operator<<
                      ((QList<QString> *)in_stack_fffffffffffff840,
                       (rvalue_ref)in_stack_fffffffffffff838);
            QString::~QString((QString *)0x10d8d0);
            QRegularExpressionMatch::captured
                      ((QRegularExpressionMatch *)in_stack_fffffffffffff850,
                       (int)((ulong)in_stack_fffffffffffff848 >> 0x20));
            QList<QString>::operator<<
                      ((QList<QString> *)in_stack_fffffffffffff840,
                       (rvalue_ref)in_stack_fffffffffffff838);
            QString::~QString((QString *)0x10d90c);
            QRegularExpressionMatch::~QRegularExpressionMatch((QRegularExpressionMatch *)0x10d919);
          }
          QRegularExpressionMatchIterator::~QRegularExpressionMatchIterator
                    ((QRegularExpressionMatchIterator *)0x10d92b);
          QRegularExpression::~QRegularExpression((QRegularExpression *)0x10d938);
        }
        local_268 = 0xaaaaaaaaaaaaaaaa;
        local_260 = 0xaaaaaaaaaaaaaaaa;
        local_258 = 0xaaaaaaaaaaaaaaaa;
        QRegularExpressionMatch::captured
                  ((QRegularExpressionMatch *)in_stack_fffffffffffff850,
                   (int)((ulong)in_stack_fffffffffffff848 >> 0x20));
        local_280 = 0xaaaaaaaaaaaaaaaa;
        local_278 = 0xaaaaaaaaaaaaaaaa;
        local_270 = 0xaaaaaaaaaaaaaaaa;
        QRegularExpressionMatch::captured
                  ((QRegularExpressionMatch *)in_stack_fffffffffffff850,
                   (int)((ulong)in_stack_fffffffffffff848 >> 0x20));
        QArrayDataPointer<char16_t>::QArrayDataPointer(local_2b0,(Data *)0x0,L"FLAGS",5);
        QString::QString((QString *)in_stack_fffffffffffff840,in_stack_fffffffffffff838);
        bVar1 = ::operator==((QString *)in_stack_fffffffffffff840,
                             (QString *)in_stack_fffffffffffff838);
        QString::~QString((QString *)0x10da4e);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(in_stack_fffffffffffff840);
        local_2c8 = 0xaaaaaaaaaaaaaaaa;
        local_2c0 = 0xaaaaaaaaaaaaaaaa;
        local_2b8 = 0xaaaaaaaaaaaaaaaa;
        findEnumValues(in_stack_fffffffffffff8c8,in_RDI,includes_00);
        bVar2 = QList<QString>::isEmpty((QList<QString> *)0x10dac7);
        if (bVar2) {
          if (bVar1) {
            QLatin1Char::QLatin1Char(local_2cb,'s');
            QChar::QChar<QLatin1Char,_true>
                      ((QChar *)in_stack_fffffffffffff840,
                       (QLatin1Char)(char)((ulong)in_stack_fffffffffffff848 >> 0x38));
            bVar2 = QString::endsWith((QString *)in_stack_fffffffffffff848,
                                      (QChar)(char16_t)((ulong)in_stack_fffffffffffff858 >> 0x30),
                                      (CaseSensitivity)((ulong)in_stack_fffffffffffff840 >> 0x20));
            if (bVar2) {
              QString::length((QString *)0x10db32);
              QString::left((QString *)in_stack_fffffffffffff858,
                            (qsizetype)in_stack_fffffffffffff850);
              findEnumValues(in_stack_fffffffffffff8c8,in_RDI,includes_00);
              QList<QString>::operator=
                        ((QList<QString> *)in_stack_fffffffffffff840,
                         (QList<QString> *)in_stack_fffffffffffff838);
              QList<QString>::~QList((QList<QString> *)0x10db95);
              QString::~QString((QString *)0x10dba2);
            }
          }
          QList<QString>::isEmpty((QList<QString> *)0x10dbaf);
        }
        bVar2 = QList<QString>::isEmpty((QList<QString> *)0x10dbc6);
        if (!bVar2) {
          local_318 = 0xaaaaaaaaaaaaaaaa;
          local_310 = 0xaaaaaaaaaaaaaaaa;
          local_308 = 0xaaaaaaaaaaaaaaaa;
          enumsToValues(includes_00);
          qVar8 = QList<QString>::size(&local_198);
          if (qVar8 != 0) {
            for (local_6dc = 0; qVar8 = QList<QString>::size(&local_198),
                (long)local_6dc < qVar8 / 2; local_6dc = local_6dc + 1) {
              bVar2 = false;
              local_320.i = (EnumNameValue *)0xaaaaaaaaaaaaaaaa;
              local_320 = QList<EnumNameValue>::begin
                                    ((QList<EnumNameValue> *)in_stack_fffffffffffff840);
              local_328.i = (EnumNameValue *)0xaaaaaaaaaaaaaaaa;
              local_328 = QList<EnumNameValue>::end
                                    ((QList<EnumNameValue> *)in_stack_fffffffffffff840);
              while( true ) {
                local_330 = local_328.i;
                bVar3 = QList<EnumNameValue>::iterator::operator!=(&local_320,local_328);
                if (!bVar3) break;
                pEVar4 = QList<EnumNameValue>::iterator::operator*(&local_320);
                in_stack_fffffffffffff888 = pEVar4;
                QList<QString>::operator[]
                          ((QList<QString> *)in_stack_fffffffffffff840,
                           (qsizetype)in_stack_fffffffffffff838);
                bVar3 = ::operator==((QString *)in_stack_fffffffffffff840,
                                     (QString *)in_stack_fffffffffffff838);
                if (bVar3) {
                  bVar2 = true;
                  local_348.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
                  local_348.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
                  local_348.d.size = -0x5555555555555556;
                  QList<QString>::operator[]
                            ((QList<QString> *)in_stack_fffffffffffff840,
                             (qsizetype)in_stack_fffffffffffff838);
                  QString::QString((QString *)in_stack_fffffffffffff840,
                                   (QString *)in_stack_fffffffffffff838);
                  local_350.i = (EnumNameValue *)0xaaaaaaaaaaaaaaaa;
                  QList<EnumNameValue>::begin((QList<EnumNameValue> *)in_stack_fffffffffffff840);
                  QList<EnumNameValue>::end((QList<EnumNameValue> *)in_stack_fffffffffffff840);
                  iVar5.i._4_4_ = in_stack_fffffffffffff874;
                  iVar5.i._0_4_ = in_stack_fffffffffffff870;
                  local_350 = std::
                              find_if<QList<EnumNameValue>::iterator,Parser::parseMetadata(QString_const&,long_long,QList<QString>const&)::__0>
                                        (in_stack_fffffffffffff878,iVar5,in_stack_fffffffffffff868);
                  iVar5 = QList<EnumNameValue>::end
                                    ((QList<EnumNameValue> *)in_stack_fffffffffffff840);
                  bVar3 = QList<EnumNameValue>::iterator::operator!=(&local_350,iVar5);
                  if (bVar3) {
                    QArrayDataPointer<char16_t>::QArrayDataPointer
                              (local_3c8,(Data *)0x0,L"RANGE(%1, %2 ... %3)",0x14);
                    QString::QString((QString *)in_stack_fffffffffffff840,in_stack_fffffffffffff838)
                    ;
                    in_stack_fffffffffffff878.i = pEVar4;
                    QChar::QChar<char16_t,_true>(&local_3ca,L' ');
                    QString::arg<QString,_true>
                              ((QString *)
                               CONCAT17(in_stack_fffffffffffff867,in_stack_fffffffffffff860),
                               (QString *)in_stack_fffffffffffff858,
                               (int)((ulong)in_stack_fffffffffffff850 >> 0x20),
                               (QChar)(char16_t)((ulong)in_stack_fffffffffffff888 >> 0x30));
                    in_stack_fffffffffffff880 = pEVar4->value;
                    QChar::QChar<char16_t,_true>(&local_3cc,L' ');
                    QString::arg<int,_true>
                              ((QString *)in_stack_fffffffffffff848,
                               (int)((ulong)in_stack_fffffffffffff840 >> 0x20),
                               (int)in_stack_fffffffffffff840,
                               (int)((ulong)in_stack_fffffffffffff838 >> 0x20),
                               (QChar)(char16_t)((ulong)in_stack_fffffffffffff858 >> 0x30));
                    pEVar4 = QList<EnumNameValue>::iterator::operator->(&local_350);
                    in_stack_fffffffffffff884 = pEVar4->value;
                    QChar::QChar<char16_t,_true>(&local_3ce,L' ');
                    QString::arg<int,_true>
                              ((QString *)in_stack_fffffffffffff848,
                               (int)((ulong)in_stack_fffffffffffff840 >> 0x20),
                               (int)in_stack_fffffffffffff840,
                               (int)((ulong)in_stack_fffffffffffff838 >> 0x20),
                               (QChar)(char16_t)((ulong)in_stack_fffffffffffff858 >> 0x30));
                    QString::operator=((QString *)in_stack_fffffffffffff840,
                                       (QString *)in_stack_fffffffffffff838);
                    QString::~QString((QString *)0x10dfd3);
                    QString::~QString((QString *)0x10dfe0);
                    QString::~QString((QString *)0x10dfed);
                    QString::~QString((QString *)0x10dffa);
                    QArrayDataPointer<char16_t>::~QArrayDataPointer(in_stack_fffffffffffff840);
                  }
                  else {
                    QtPrivate::asString(&local_348);
                    QString::toLocal8Bit((QString *)in_stack_fffffffffffff858);
                    pcVar6 = QByteArray::constData((QByteArray *)0x10e033);
                    panic("Unable to find range end: %s\n",pcVar6);
                    QByteArray::~QByteArray((QByteArray *)0x10e051);
                  }
                  QString::~QString((QString *)0x10e069);
                  break;
                }
                QList<EnumNameValue>::iterator::operator++(&local_320);
              }
              if (!bVar2) {
                s = QList<QString>::operator[]
                              ((QList<QString> *)in_stack_fffffffffffff840,
                               (qsizetype)in_stack_fffffffffffff838);
                QtPrivate::asString(s);
                QString::toLocal8Bit((QString *)in_stack_fffffffffffff858);
                pcVar6 = QByteArray::constData((QByteArray *)0x10e0ce);
                panic("Unable to find range begin: %s\n",pcVar6);
                QByteArray::~QByteArray((QByteArray *)0x10e0ec);
              }
            }
          }
          in_stack_fffffffffffff8e8 =
               QList<EnumNameValue>::begin((QList<EnumNameValue> *)in_stack_fffffffffffff840);
          iVar5 = QList<EnumNameValue>::end((QList<EnumNameValue> *)in_stack_fffffffffffff840);
          std::
          sort<QList<EnumNameValue>::iterator,Parser::parseMetadata(QString_const&,long_long,QList<QString>const&)::__1>
                    (in_stack_fffffffffffff8e8.i,iVar5.i);
          QList<QString>::clear((QList<QString> *)in_stack_fffffffffffff840);
          pEVar7 = QList<EnumNameValue>::front((QList<EnumNameValue> *)0x10e15f);
          local_728 = pEVar7->value;
          local_408[0].i = (EnumNameValue *)0xaaaaaaaaaaaaaaaa;
          local_408[0] = QList<EnumNameValue>::begin
                                   ((QList<EnumNameValue> *)in_stack_fffffffffffff840);
          local_410.i = (EnumNameValue *)0xaaaaaaaaaaaaaaaa;
          local_410 = QList<EnumNameValue>::end((QList<EnumNameValue> *)in_stack_fffffffffffff840);
          while( true ) {
            local_418 = local_410.i;
            bVar2 = QList<EnumNameValue>::const_iterator::operator!=(local_408,local_410);
            if (!bVar2) break;
            in_stack_fffffffffffff8c8 =
                 (Parser *)QList<EnumNameValue>::const_iterator::operator*(local_408);
            local_430 = 0xaaaaaaaaaaaaaaaa;
            local_428 = 0xaaaaaaaaaaaaaaaa;
            local_420 = 0xaaaaaaaaaaaaaaaa;
            QString::QString((QString *)0x10e262);
            bVar2 = QString::isNull((QString *)0x10e273);
            if (bVar2) {
              if ((*(int *)&(in_stack_fffffffffffff8c8->m_replaces).d.d != local_728 + 1) || (bVar1)
                 ) {
                QArrayDataPointer<char16_t>::QArrayDataPointer(local_490,(Data *)0x0,L"%1 = %2",7);
                in_stack_fffffffffffff868.rangeEnd = (QString *)in_stack_fffffffffffff8c8;
                QString::QString((QString *)in_stack_fffffffffffff840,in_stack_fffffffffffff838);
                in_stack_fffffffffffff8c8 = (Parser *)in_stack_fffffffffffff868.rangeEnd;
                QChar::QChar<char16_t,_true>(&local_492,L' ');
                QString::arg<QString,_true>
                          ((QString *)CONCAT17(in_stack_fffffffffffff867,in_stack_fffffffffffff860),
                           (QString *)in_stack_fffffffffffff858,
                           (int)((ulong)in_stack_fffffffffffff850 >> 0x20),
                           (QChar)(char16_t)((ulong)in_stack_fffffffffffff888 >> 0x30));
                in_stack_fffffffffffff874 =
                     *(MatchType *)&(in_stack_fffffffffffff8c8->m_replaces).d.d;
                QChar::QChar<char16_t,_true>(&local_494,L' ');
                QString::arg<int,_true>
                          ((QString *)in_stack_fffffffffffff848,
                           (int)((ulong)in_stack_fffffffffffff840 >> 0x20),
                           (int)in_stack_fffffffffffff840,
                           (int)((ulong)in_stack_fffffffffffff838 >> 0x20),
                           (QChar)(char16_t)((ulong)in_stack_fffffffffffff858 >> 0x30));
                QString::operator=((QString *)in_stack_fffffffffffff840,
                                   (QString *)in_stack_fffffffffffff838);
                QString::~QString((QString *)0x10e3cc);
                QString::~QString((QString *)0x10e3d9);
                QString::~QString((QString *)0x10e3e6);
                QArrayDataPointer<char16_t>::~QArrayDataPointer(in_stack_fffffffffffff840);
              }
              else {
                QString::operator=((QString *)in_stack_fffffffffffff840,
                                   (QString *)in_stack_fffffffffffff838);
              }
              local_728 = *(int *)&(in_stack_fffffffffffff8c8->m_replaces).d.d;
            }
            else {
              QString::operator=((QString *)in_stack_fffffffffffff840,
                                 (QString *)in_stack_fffffffffffff838);
            }
            QList<QString>::operator<<
                      ((QList<QString> *)in_stack_fffffffffffff840,
                       (parameter_type)in_stack_fffffffffffff838);
            QString::~QString((QString *)0x10e442);
            QList<EnumNameValue>::const_iterator::operator++(local_408);
          }
          QArrayDataPointer<char16_t>::QArrayDataPointer
                    (local_510,(Data *)0x0,L"%1 {\n %2 \n} %3;",0xf);
          QString::QString((QString *)in_stack_fffffffffffff840,in_stack_fffffffffffff838);
          QChar::QChar<char16_t,_true>(&local_512,L' ');
          QString::arg<QString,_true>
                    ((QString *)CONCAT17(in_stack_fffffffffffff867,in_stack_fffffffffffff860),
                     (QString *)in_stack_fffffffffffff858,
                     (int)((ulong)in_stack_fffffffffffff850 >> 0x20),
                     (QChar)(char16_t)((ulong)in_stack_fffffffffffff888 >> 0x30));
          QArrayDataPointer<char16_t>::QArrayDataPointer(local_560,(Data *)0x0,L",\n",2);
          QString::QString((QString *)in_stack_fffffffffffff840,in_stack_fffffffffffff838);
          QListSpecialMethods<QString>::join(in_stack_fffffffffffff858,in_stack_fffffffffffff850);
          QChar::QChar<char16_t,_true>(&local_562,L' ');
          QString::arg<QString,_true>
                    ((QString *)CONCAT17(in_stack_fffffffffffff867,in_stack_fffffffffffff860),
                     (QString *)in_stack_fffffffffffff858,
                     (int)((ulong)in_stack_fffffffffffff850 >> 0x20),
                     (QChar)(char16_t)((ulong)in_stack_fffffffffffff888 >> 0x30));
          QChar::QChar<char16_t,_true>(&local_564,L' ');
          QString::arg<QString,_true>
                    ((QString *)CONCAT17(in_stack_fffffffffffff867,in_stack_fffffffffffff860),
                     (QString *)in_stack_fffffffffffff858,
                     (int)((ulong)in_stack_fffffffffffff850 >> 0x20),
                     (QChar)(char16_t)((ulong)in_stack_fffffffffffff888 >> 0x30));
          QString::operator=((QString *)in_stack_fffffffffffff840,
                             (QString *)in_stack_fffffffffffff838);
          QString::~QString((QString *)0x10e605);
          QString::~QString((QString *)0x10e612);
          QString::~QString((QString *)0x10e61f);
          QString::~QString((QString *)0x10e62c);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(in_stack_fffffffffffff840);
          QString::~QString((QString *)0x10e646);
          QString::~QString((QString *)0x10e653);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(in_stack_fffffffffffff840);
          bVar1 = QListSpecialMethods<QString>::contains
                            (in_stack_fffffffffffff848,(QString *)in_stack_fffffffffffff840,
                             (CaseSensitivity)((ulong)in_stack_fffffffffffff838 >> 0x20));
          if (!bVar1) {
            QList<QString>::append
                      ((QList<QString> *)in_stack_fffffffffffff840,
                       (parameter_type)in_stack_fffffffffffff838);
          }
          QList<EnumNameValue>::~QList((QList<EnumNameValue> *)0x10e6a8);
        }
        QList<QString>::~QList((QList<QString> *)0x10e6b5);
        QString::~QString((QString *)0x10e6c2);
        QString::~QString((QString *)0x10e6cf);
        QList<QString>::~QList((QList<QString> *)0x10e6dc);
      }
      QString::~QString((QString *)0x10e793);
      QRegularExpressionMatch::~QRegularExpressionMatch((QRegularExpressionMatch *)0x10e7a0);
    }
    pQVar9 = local_6d0;
    qVar8 = QString::length((QString *)0x10e7bf);
    if ((long)pQVar9 < qVar8) {
      this_00 = (QList<QString> *)(in_RDI + 4);
      QString::length((QString *)0x10e7f6);
      QString::mid(in_stack_fffffffffffff868.rangeEnd,
                   CONCAT17(in_stack_fffffffffffff867,in_stack_fffffffffffff860),
                   (qsizetype)in_stack_fffffffffffff858);
      QList<QString>::append(this_00,local_6d0);
      QString::~QString((QString *)0x10e839);
    }
    QRegularExpressionMatchIterator::~QRegularExpressionMatchIterator
              ((QRegularExpressionMatchIterator *)0x10e846);
    QRegularExpression::~QRegularExpression((QRegularExpression *)0x10e853);
    QString::~QString((QString *)0x10e860);
  }
  QString::~QString((QString *)0x10e878);
  QString::~QString((QString *)0x10e885);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Parser::parseMetadata(const QString &data, qsizetype offset, const QStringList &includes)
{
    qsizetype beginOfProvider = data.indexOf(QLatin1Char('('), offset);
    qsizetype endOfProvider = data.indexOf(QLatin1Char(','), beginOfProvider);
    QString metadata;
    QString provider = data.mid(beginOfProvider + 1, endOfProvider - beginOfProvider - 1).simplified();
    if (provider != m_provider)
        return;

    qsizetype endOfPoint = data.indexOf(QLatin1Char(')'), endOfProvider + 1);
    metadata = data.mid(endOfProvider + 1, endOfPoint - endOfProvider - 1).simplified();

    DEBUGPRINTF(printf("tracepointgen: metadata: %s", qPrintable(metadata)));

    QString preprocessed = preprocessMetadata(metadata);

    DEBUGPRINTF2(printf("preprocessed %s\n", qPrintable(preprocessed)));

    QRegularExpression macro(QStringLiteral("([A-Z]*) ?{ ?([A-Za-z0-9=_,. ]*) ?} ?([A-Za-z0-9_:]*) ?;"));
    QRegularExpressionMatchIterator i = macro.globalMatch(preprocessed);
    qsizetype prev = 0;
    while (i.hasNext()) {
        QRegularExpressionMatch match = i.next();
        QString values = match.captured(2).trimmed();
        int cur = match.capturedStart();
        if (cur > prev)
            m_metadata.append(preprocessed.mid(prev, cur - prev));

        prev = match.capturedEnd() + 1;
        DEBUGPRINTF2(printf("values: %s\n", qPrintable(values)));
        if (values.isEmpty() || values.startsWith(QStringLiteral("AUTO"))) {
            values.replace(QLatin1Char('\n'), QLatin1Char(' '));
            QStringList ranges;
            if (values.contains(QStringLiteral("RANGE"))) {
                QRegularExpression rangeMacro(QStringLiteral("RANGE +([A-Za-z0-9_]*) +... +([A-Za-z0-9_]*)"));
                QRegularExpressionMatchIterator r = rangeMacro.globalMatch(values);
                while (r.hasNext()) {
                    QRegularExpressionMatch rm = r.next();
                    ranges << rm.captured(1);
                    ranges << rm.captured(2);
                    DEBUGPRINTF2(printf("range: %s ... %s\n", qPrintable(rm.captured(1)), qPrintable(rm.captured(2))));
                }
            }

            const auto enumOrFlag = match.captured(1);
            const auto name = match.captured(3);
            const bool flags = enumOrFlag == QStringLiteral("FLAGS");

            QStringList values = findEnumValues(name, includes);
            if (values.isEmpty()) {
                if (flags && name.endsWith(QLatin1Char('s')))
                    values = findEnumValues(name.left(name.length() - 1), includes);
                if (values.isEmpty()) {
                    DEBUGPRINTF(printf("Unable to find values for %s\n", qPrintable(name)));
                }
            }
            if (!values.isEmpty()) {
                auto moreValues = enumsToValues(values);
                if (ranges.size()) {
                    for (int i = 0; i < ranges.size() / 2; i++) {
                        bool rangeFound = false;
                        for (auto &v : moreValues) {
                            if (v.name == ranges[2 * i]) {
                                rangeFound = true;
                                QString rangeEnd = ranges[2 * i + 1];
                                auto iter = std::find_if(moreValues.begin(), moreValues.end(), [&rangeEnd](const EnumNameValue &elem){
                                    return elem.name == rangeEnd;
                                });
                                if (iter != moreValues.end())
                                    v.valueStr = QStringLiteral("RANGE(%1, %2 ... %3)").arg(v.name).arg(v.value).arg(iter->value);
                                else
                                    panic("Unable to find range end: %s\n", qPrintable(rangeEnd));
                                break;
                            }
                        }
                        if (rangeFound == false)
                            panic("Unable to find range begin: %s\n", qPrintable(ranges[2 * i]));
                    }
                }
                std::sort(moreValues.begin(), moreValues.end(), [](const EnumNameValue &a, const EnumNameValue &b) {
                    return a.value < b.value;
                });
                values.clear();
                int prevValue = std::as_const(moreValues).front().value;
                for (const auto &v : std::as_const(moreValues)) {
                    QString a;
                    if (v.valueStr.isNull()) {
                        if (v.value == prevValue + 1 && !flags)
                            a = v.name;
                        else
                            a = QStringLiteral("%1 = %2").arg(v.name).arg(v.value);
                        prevValue = v.value;
                    } else {
                        a = v.valueStr;
                    }
                    values << a;
                }

                metadata = QStringLiteral("%1 {\n %2 \n} %3;").arg(enumOrFlag).arg(values.join(QStringLiteral(",\n"))).arg(name);
                if (!m_metadata.contains(metadata))
                    m_metadata.append(metadata);
            }
        } else {
            if (!m_metadata.contains(match.captured()))
                m_metadata.append(match.captured());
        }
    }
    if (prev < preprocessed.length())
        m_metadata.append(preprocessed.mid(prev, preprocessed.length() - prev));
}